

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O0

void __thiscall
Assimp::SMDImporter::ParseVertex
          (SMDImporter *this,char *szCurrent,char **szCurrentOut,Vertex *vertex,bool bVASection)

{
  char **ppcVar1;
  bool bVar2;
  vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_> *this_00;
  ulong __new_size;
  reference ppVar3;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_50;
  __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
  local_48;
  iterator i;
  pair<unsigned_int,_float> local_38;
  uint local_30;
  byte local_29;
  uint iSize;
  bool bVASection_local;
  Vertex *vertex_local;
  char **szCurrentOut_local;
  char *szCurrent_local;
  SMDImporter *this_local;
  
  local_29 = bVASection;
  _iSize = vertex;
  vertex_local = (Vertex *)szCurrentOut;
  szCurrentOut_local = (char **)szCurrent;
  szCurrent_local = (char *)this;
  bVar2 = SkipSpaces<char>((char **)&szCurrentOut_local);
  if ((bVar2) && (bVar2 = IsLineEnd<char>(*(char *)szCurrentOut_local), bVar2)) {
    SkipSpacesAndLineEnd(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
    ParseVertex(this,(char *)szCurrentOut_local,(char **)vertex_local,_iSize,(bool)(local_29 & 1));
  }
  else {
    bVar2 = ParseSignedInt(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                           (int *)&_iSize->iParentNode);
    if (bVar2) {
      bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                         (float *)_iSize);
      if (bVar2) {
        bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                           &(_iSize->pos).y);
        if (bVar2) {
          bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                             &(_iSize->pos).z);
          if (bVar2) {
            bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                               &(_iSize->nor).x);
            if (bVar2) {
              bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                                 &(_iSize->nor).y);
              if (bVar2) {
                bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                                   &(_iSize->nor).z);
                if (bVar2) {
                  if ((local_29 & 1) == 0) {
                    bVar2 = ParseFloat(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local,
                                       &(_iSize->uv).x);
                    if (bVar2) {
                      bVar2 = ParseFloat(this,(char *)szCurrentOut_local,
                                         (char **)&szCurrentOut_local,&(_iSize->uv).y);
                      if (bVar2) {
                        local_30 = 0;
                        bVar2 = ParseUnsignedInt(this,(char *)szCurrentOut_local,
                                                 (char **)&szCurrentOut_local,&local_30);
                        if (bVar2) {
                          this_00 = &_iSize->aiBoneLinks;
                          __new_size = (ulong)local_30;
                          i._M_current._4_4_ = 0;
                          i._M_current._0_4_ = 0;
                          std::pair<unsigned_int,_float>::pair<int,_float,_true>
                                    (&local_38,(int *)((long)&i._M_current + 4),(float *)&i);
                          std::
                          vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                          ::resize(this_00,__new_size,&local_38);
                          local_48._M_current =
                               (pair<unsigned_int,_float> *)
                               std::
                               vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                               ::begin(&_iSize->aiBoneLinks);
                          while( true ) {
                            local_50._M_current =
                                 (pair<unsigned_int,_float> *)
                                 std::
                                 vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>
                                 ::end(&_iSize->aiBoneLinks);
                            bVar2 = __gnu_cxx::operator!=(&local_48,&local_50);
                            ppcVar1 = szCurrentOut_local;
                            if (!bVar2) break;
                            ppVar3 = __gnu_cxx::
                                     __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                     ::operator*(&local_48);
                            bVar2 = ParseUnsignedInt(this,(char *)ppcVar1,
                                                     (char **)&szCurrentOut_local,&ppVar3->first);
                            ppcVar1 = szCurrentOut_local;
                            if (!bVar2) {
                              SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local)
                              ;
                              *(char ***)&vertex_local->pos = szCurrentOut_local;
                              return;
                            }
                            ppVar3 = __gnu_cxx::
                                     __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                                     ::operator*(&local_48);
                            bVar2 = ParseFloat(this,(char *)ppcVar1,(char **)&szCurrentOut_local,
                                               &ppVar3->second);
                            if (!bVar2) {
                              SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local)
                              ;
                              *(char ***)&vertex_local->pos = szCurrentOut_local;
                              return;
                            }
                            __gnu_cxx::
                            __normal_iterator<std::pair<unsigned_int,_float>_*,_std::vector<std::pair<unsigned_int,_float>,_std::allocator<std::pair<unsigned_int,_float>_>_>_>
                            ::operator++(&local_48);
                          }
                          SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                          *(char ***)&vertex_local->pos = szCurrentOut_local;
                        }
                        else {
                          SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                          *(char ***)&vertex_local->pos = szCurrentOut_local;
                        }
                      }
                      else {
                        LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.uv.y");
                        SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                        *(char ***)&vertex_local->pos = szCurrentOut_local;
                      }
                    }
                    else {
                      LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.uv.x");
                      SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                      *(char ***)&vertex_local->pos = szCurrentOut_local;
                    }
                  }
                  else {
                    SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                    *(char ***)&vertex_local->pos = szCurrentOut_local;
                  }
                }
                else {
                  LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.z");
                  SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                  *(char ***)&vertex_local->pos = szCurrentOut_local;
                }
              }
              else {
                LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.y");
                SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
                *(char ***)&vertex_local->pos = szCurrentOut_local;
              }
            }
            else {
              LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.nor.x");
              SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
              *(char ***)&vertex_local->pos = szCurrentOut_local;
            }
          }
          else {
            LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.z");
            SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
            *(char ***)&vertex_local->pos = szCurrentOut_local;
          }
        }
        else {
          LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.y");
          SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
          *(char ***)&vertex_local->pos = szCurrentOut_local;
        }
      }
      else {
        LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.pos.x");
        SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
        *(char ***)&vertex_local->pos = szCurrentOut_local;
      }
    }
    else {
      LogErrorNoThrow(this,"Unexpected EOF/EOL while parsing vertex.parent");
      SkipLine(this,(char *)szCurrentOut_local,(char **)&szCurrentOut_local);
      *(char ***)&vertex_local->pos = szCurrentOut_local;
    }
  }
  return;
}

Assistant:

void SMDImporter::ParseVertex(const char* szCurrent,
        const char** szCurrentOut, SMD::Vertex& vertex,
        bool bVASection /*= false*/) {
    if (SkipSpaces(&szCurrent) && IsLineEnd(*szCurrent)) {
        SkipSpacesAndLineEnd(szCurrent,&szCurrent);
        return ParseVertex(szCurrent,szCurrentOut,vertex,bVASection);
    }
    if(!ParseSignedInt(szCurrent,&szCurrent,(int&)vertex.iParentNode)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.parent");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.pos.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.pos.z");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.y");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.nor.z)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.nor.z");
        SMDI_PARSE_RETURN;
    }

    if (bVASection) {
        SMDI_PARSE_RETURN;
    }

    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.uv.x)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.uv.x");
        SMDI_PARSE_RETURN;
    }
    if(!ParseFloat(szCurrent,&szCurrent,(float&)vertex.uv.y)) {
        LogErrorNoThrow("Unexpected EOF/EOL while parsing vertex.uv.y");
        SMDI_PARSE_RETURN;
    }

    // now read the number of bones affecting this vertex
    // all elements from now are fully optional, we don't need them
    unsigned int iSize = 0;
    if(!ParseUnsignedInt(szCurrent,&szCurrent,iSize)) {
        SMDI_PARSE_RETURN;
    }
    vertex.aiBoneLinks.resize(iSize,std::pair<unsigned int, float>(0,0.0f));

    for (std::vector<std::pair<unsigned int, float> >::iterator
            i =  vertex.aiBoneLinks.begin();
            i != vertex.aiBoneLinks.end();++i) {
        if(!ParseUnsignedInt(szCurrent,&szCurrent,(*i).first)) {
            SMDI_PARSE_RETURN;
        }
        if(!ParseFloat(szCurrent,&szCurrent,(*i).second)) {
            SMDI_PARSE_RETURN;
        }
    }

    // go to the beginning of the next line
    SMDI_PARSE_RETURN;
}